

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Option<unsigned_long> __thiscall Catch::list(Catch *this,shared_ptr<Catch::Config> *config)

{
  IMutableContext *pIVar1;
  size_t sVar2;
  char extraout_RDX [8];
  char extraout_RDX_00 [8];
  char extraout_RDX_01 [8];
  char extraout_RDX_02 [8];
  char extraout_RDX_03 [8];
  char acVar3 [8];
  element_type *config_00;
  long lVar4;
  Option<unsigned_long> OVar5;
  __shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  *(undefined8 *)this = 0;
  pIVar1 = getCurrentMutableContext();
  std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Catch::Config,void>
            (local_30,&config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
  (*(pIVar1->super_IContext)._vptr_IContext[7])(pIVar1,local_30);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  config_00 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((config_00->m_data).listTests == true) {
    sVar2 = listTests(config_00);
    *(size_t *)(this + 8) = sVar2;
    *(Catch **)this = this + 8;
    config_00 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    acVar3 = extraout_RDX_00;
    if ((config_00->m_data).listTestNamesOnly != false) {
      lVar4 = *(long *)(this + 8);
LAB_0011bb79:
      sVar2 = listTestsNamesOnly(config_00);
      *(size_t *)(this + 8) = sVar2 + lVar4;
      *(Catch **)this = this + 8;
      config_00 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      acVar3 = extraout_RDX_01;
    }
    if ((config_00->m_data).listTags != false) {
      lVar4 = *(long *)(this + 8);
LAB_0011bba3:
      sVar2 = listTags(config_00);
      *(size_t *)(this + 8) = sVar2 + lVar4;
      *(Catch **)this = this + 8;
      config_00 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      acVar3 = extraout_RDX_02;
    }
    if ((config_00->m_data).listReporters == false) goto LAB_0011bbd5;
    lVar4 = *(long *)(this + 8);
  }
  else {
    if ((config_00->m_data).listTestNamesOnly != false) {
      lVar4 = 0;
      goto LAB_0011bb79;
    }
    if ((config_00->m_data).listTags != false) {
      lVar4 = 0;
      goto LAB_0011bba3;
    }
    acVar3 = extraout_RDX;
    if ((config_00->m_data).listReporters == false) goto LAB_0011bbd5;
    lVar4 = 0;
  }
  sVar2 = listReporters();
  *(size_t *)(this + 8) = sVar2 + lVar4;
  *(Catch **)this = this + 8;
  acVar3 = extraout_RDX_03;
LAB_0011bbd5:
  OVar5.storage[0] = acVar3[0];
  OVar5.storage[1] = acVar3[1];
  OVar5.storage[2] = acVar3[2];
  OVar5.storage[3] = acVar3[3];
  OVar5.storage[4] = acVar3[4];
  OVar5.storage[5] = acVar3[5];
  OVar5.storage[6] = acVar3[6];
  OVar5.storage[7] = acVar3[7];
  OVar5.nullableValue = (unsigned_long *)this;
  return OVar5;
}

Assistant:

Option<std::size_t> list( std::shared_ptr<Config> const& config ) {
        Option<std::size_t> listedCount;
        getCurrentMutableContext().setConfig( config );
        if( config->listTests() )
            listedCount = listedCount.valueOr(0) + listTests( *config );
        if( config->listTestNamesOnly() )
            listedCount = listedCount.valueOr(0) + listTestsNamesOnly( *config );
        if( config->listTags() )
            listedCount = listedCount.valueOr(0) + listTags( *config );
        if( config->listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters();
        return listedCount;
    }